

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  ulong uVar1;
  wchar_t *__result;
  size_t free_cap;
  type count;
  wchar_t *end_local;
  wchar_t *begin_local;
  buffer<wchar_t> *this_local;
  
  end_local = begin;
  do {
    free_cap = to_unsigned<long>((long)end - (long)end_local >> 2);
    try_reserve(this,this->size_ + free_cap);
    uVar1 = this->capacity_ - this->size_;
    if (uVar1 < free_cap) {
      free_cap = uVar1;
    }
    __result = make_checked<wchar_t>(this->ptr_ + this->size_,free_cap);
    std::uninitialized_copy_n<wchar_t_const*,unsigned_long,wchar_t*>(end_local,free_cap,__result);
    this->size_ = free_cap + this->size_;
    end_local = end_local + free_cap;
  } while (end_local != end);
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  do {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  } while (begin != end);
}